

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  size_t i;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  if (len < 0x10000) {
    iVar6 = 0;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
  }
  else {
    auVar15._8_8_ = 0x80800d0c80800b0a;
    auVar15._0_8_ = 0x80800d0c80800b0a;
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
    iVar6 = 0;
    do {
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      lVar9 = 0;
      do {
        uVar1 = *(undefined2 *)((long)data + lVar9);
        auVar17._2_2_ = uVar1;
        auVar17._0_2_ = uVar1;
        auVar17._4_2_ = uVar1;
        auVar17._6_2_ = uVar1;
        auVar17._8_2_ = uVar1;
        auVar17._10_2_ = uVar1;
        auVar17._12_2_ = uVar1;
        auVar17._14_2_ = uVar1;
        auVar17._16_2_ = uVar1;
        auVar17._18_2_ = uVar1;
        auVar17._20_2_ = uVar1;
        auVar17._22_2_ = uVar1;
        auVar17._24_2_ = uVar1;
        auVar17._26_2_ = uVar1;
        auVar17._28_2_ = uVar1;
        auVar17._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar17,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar13._0_32_,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 2);
        auVar18._2_2_ = uVar1;
        auVar18._0_2_ = uVar1;
        auVar18._4_2_ = uVar1;
        auVar18._6_2_ = uVar1;
        auVar18._8_2_ = uVar1;
        auVar18._10_2_ = uVar1;
        auVar18._12_2_ = uVar1;
        auVar18._14_2_ = uVar1;
        auVar18._16_2_ = uVar1;
        auVar18._18_2_ = uVar1;
        auVar18._20_2_ = uVar1;
        auVar18._22_2_ = uVar1;
        auVar18._24_2_ = uVar1;
        auVar18._26_2_ = uVar1;
        auVar18._28_2_ = uVar1;
        auVar18._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar18,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 4);
        auVar19._2_2_ = uVar1;
        auVar19._0_2_ = uVar1;
        auVar19._4_2_ = uVar1;
        auVar19._6_2_ = uVar1;
        auVar19._8_2_ = uVar1;
        auVar19._10_2_ = uVar1;
        auVar19._12_2_ = uVar1;
        auVar19._14_2_ = uVar1;
        auVar19._16_2_ = uVar1;
        auVar19._18_2_ = uVar1;
        auVar19._20_2_ = uVar1;
        auVar19._22_2_ = uVar1;
        auVar19._24_2_ = uVar1;
        auVar19._26_2_ = uVar1;
        auVar19._28_2_ = uVar1;
        auVar19._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar19,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 6);
        auVar20._2_2_ = uVar1;
        auVar20._0_2_ = uVar1;
        auVar20._4_2_ = uVar1;
        auVar20._6_2_ = uVar1;
        auVar20._8_2_ = uVar1;
        auVar20._10_2_ = uVar1;
        auVar20._12_2_ = uVar1;
        auVar20._14_2_ = uVar1;
        auVar20._16_2_ = uVar1;
        auVar20._18_2_ = uVar1;
        auVar20._20_2_ = uVar1;
        auVar20._22_2_ = uVar1;
        auVar20._24_2_ = uVar1;
        auVar20._26_2_ = uVar1;
        auVar20._28_2_ = uVar1;
        auVar20._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar20,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 8);
        auVar21._2_2_ = uVar1;
        auVar21._0_2_ = uVar1;
        auVar21._4_2_ = uVar1;
        auVar21._6_2_ = uVar1;
        auVar21._8_2_ = uVar1;
        auVar21._10_2_ = uVar1;
        auVar21._12_2_ = uVar1;
        auVar21._14_2_ = uVar1;
        auVar21._16_2_ = uVar1;
        auVar21._18_2_ = uVar1;
        auVar21._20_2_ = uVar1;
        auVar21._22_2_ = uVar1;
        auVar21._24_2_ = uVar1;
        auVar21._26_2_ = uVar1;
        auVar21._28_2_ = uVar1;
        auVar21._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar21,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 10);
        auVar22._2_2_ = uVar1;
        auVar22._0_2_ = uVar1;
        auVar22._4_2_ = uVar1;
        auVar22._6_2_ = uVar1;
        auVar22._8_2_ = uVar1;
        auVar22._10_2_ = uVar1;
        auVar22._12_2_ = uVar1;
        auVar22._14_2_ = uVar1;
        auVar22._16_2_ = uVar1;
        auVar22._18_2_ = uVar1;
        auVar22._20_2_ = uVar1;
        auVar22._22_2_ = uVar1;
        auVar22._24_2_ = uVar1;
        auVar22._26_2_ = uVar1;
        auVar22._28_2_ = uVar1;
        auVar22._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar22,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0xc);
        auVar23._2_2_ = uVar1;
        auVar23._0_2_ = uVar1;
        auVar23._4_2_ = uVar1;
        auVar23._6_2_ = uVar1;
        auVar23._8_2_ = uVar1;
        auVar23._10_2_ = uVar1;
        auVar23._12_2_ = uVar1;
        auVar23._14_2_ = uVar1;
        auVar23._16_2_ = uVar1;
        auVar23._18_2_ = uVar1;
        auVar23._20_2_ = uVar1;
        auVar23._22_2_ = uVar1;
        auVar23._24_2_ = uVar1;
        auVar23._26_2_ = uVar1;
        auVar23._28_2_ = uVar1;
        auVar23._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar23,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0xe);
        auVar24._2_2_ = uVar1;
        auVar24._0_2_ = uVar1;
        auVar24._4_2_ = uVar1;
        auVar24._6_2_ = uVar1;
        auVar24._8_2_ = uVar1;
        auVar24._10_2_ = uVar1;
        auVar24._12_2_ = uVar1;
        auVar24._14_2_ = uVar1;
        auVar24._16_2_ = uVar1;
        auVar24._18_2_ = uVar1;
        auVar24._20_2_ = uVar1;
        auVar24._22_2_ = uVar1;
        auVar24._24_2_ = uVar1;
        auVar24._26_2_ = uVar1;
        auVar24._28_2_ = uVar1;
        auVar24._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar24,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x10);
        auVar25._2_2_ = uVar1;
        auVar25._0_2_ = uVar1;
        auVar25._4_2_ = uVar1;
        auVar25._6_2_ = uVar1;
        auVar25._8_2_ = uVar1;
        auVar25._10_2_ = uVar1;
        auVar25._12_2_ = uVar1;
        auVar25._14_2_ = uVar1;
        auVar25._16_2_ = uVar1;
        auVar25._18_2_ = uVar1;
        auVar25._20_2_ = uVar1;
        auVar25._22_2_ = uVar1;
        auVar25._24_2_ = uVar1;
        auVar25._26_2_ = uVar1;
        auVar25._28_2_ = uVar1;
        auVar25._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar25,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x12);
        auVar26._2_2_ = uVar1;
        auVar26._0_2_ = uVar1;
        auVar26._4_2_ = uVar1;
        auVar26._6_2_ = uVar1;
        auVar26._8_2_ = uVar1;
        auVar26._10_2_ = uVar1;
        auVar26._12_2_ = uVar1;
        auVar26._14_2_ = uVar1;
        auVar26._16_2_ = uVar1;
        auVar26._18_2_ = uVar1;
        auVar26._20_2_ = uVar1;
        auVar26._22_2_ = uVar1;
        auVar26._24_2_ = uVar1;
        auVar26._26_2_ = uVar1;
        auVar26._28_2_ = uVar1;
        auVar26._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar26,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x14);
        auVar27._2_2_ = uVar1;
        auVar27._0_2_ = uVar1;
        auVar27._4_2_ = uVar1;
        auVar27._6_2_ = uVar1;
        auVar27._8_2_ = uVar1;
        auVar27._10_2_ = uVar1;
        auVar27._12_2_ = uVar1;
        auVar27._14_2_ = uVar1;
        auVar27._16_2_ = uVar1;
        auVar27._18_2_ = uVar1;
        auVar27._20_2_ = uVar1;
        auVar27._22_2_ = uVar1;
        auVar27._24_2_ = uVar1;
        auVar27._26_2_ = uVar1;
        auVar27._28_2_ = uVar1;
        auVar27._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar27,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x16);
        auVar28._2_2_ = uVar1;
        auVar28._0_2_ = uVar1;
        auVar28._4_2_ = uVar1;
        auVar28._6_2_ = uVar1;
        auVar28._8_2_ = uVar1;
        auVar28._10_2_ = uVar1;
        auVar28._12_2_ = uVar1;
        auVar28._14_2_ = uVar1;
        auVar28._16_2_ = uVar1;
        auVar28._18_2_ = uVar1;
        auVar28._20_2_ = uVar1;
        auVar28._22_2_ = uVar1;
        auVar28._24_2_ = uVar1;
        auVar28._26_2_ = uVar1;
        auVar28._28_2_ = uVar1;
        auVar28._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar28,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x18);
        auVar29._2_2_ = uVar1;
        auVar29._0_2_ = uVar1;
        auVar29._4_2_ = uVar1;
        auVar29._6_2_ = uVar1;
        auVar29._8_2_ = uVar1;
        auVar29._10_2_ = uVar1;
        auVar29._12_2_ = uVar1;
        auVar29._14_2_ = uVar1;
        auVar29._16_2_ = uVar1;
        auVar29._18_2_ = uVar1;
        auVar29._20_2_ = uVar1;
        auVar29._22_2_ = uVar1;
        auVar29._24_2_ = uVar1;
        auVar29._26_2_ = uVar1;
        auVar29._28_2_ = uVar1;
        auVar29._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar29,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x1a);
        auVar30._2_2_ = uVar1;
        auVar30._0_2_ = uVar1;
        auVar30._4_2_ = uVar1;
        auVar30._6_2_ = uVar1;
        auVar30._8_2_ = uVar1;
        auVar30._10_2_ = uVar1;
        auVar30._12_2_ = uVar1;
        auVar30._14_2_ = uVar1;
        auVar30._16_2_ = uVar1;
        auVar30._18_2_ = uVar1;
        auVar30._20_2_ = uVar1;
        auVar30._22_2_ = uVar1;
        auVar30._24_2_ = uVar1;
        auVar30._26_2_ = uVar1;
        auVar30._28_2_ = uVar1;
        auVar30._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar30,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x1c);
        auVar31._2_2_ = uVar1;
        auVar31._0_2_ = uVar1;
        auVar31._4_2_ = uVar1;
        auVar31._6_2_ = uVar1;
        auVar31._8_2_ = uVar1;
        auVar31._10_2_ = uVar1;
        auVar31._12_2_ = uVar1;
        auVar31._14_2_ = uVar1;
        auVar31._16_2_ = uVar1;
        auVar31._18_2_ = uVar1;
        auVar31._20_2_ = uVar1;
        auVar31._22_2_ = uVar1;
        auVar31._24_2_ = uVar1;
        auVar31._26_2_ = uVar1;
        auVar31._28_2_ = uVar1;
        auVar31._30_2_ = uVar1;
        auVar17 = vpand_avx2(auVar31,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar5 = vpsubw_avx2(auVar5,auVar17);
        uVar1 = *(undefined2 *)((long)data + lVar9 + 0x1e);
        auVar32._2_2_ = uVar1;
        auVar32._0_2_ = uVar1;
        auVar32._4_2_ = uVar1;
        auVar32._6_2_ = uVar1;
        auVar32._8_2_ = uVar1;
        auVar32._10_2_ = uVar1;
        auVar32._12_2_ = uVar1;
        auVar32._14_2_ = uVar1;
        auVar32._16_2_ = uVar1;
        auVar32._18_2_ = uVar1;
        auVar32._20_2_ = uVar1;
        auVar32._22_2_ = uVar1;
        auVar32._24_2_ = uVar1;
        auVar32._26_2_ = uVar1;
        auVar32._28_2_ = uVar1;
        auVar32._30_2_ = uVar1;
        lVar9 = lVar9 + 0x20;
        auVar17 = vpand_avx2(auVar32,_DAT_00122080);
        auVar17 = vpcmpeqw_avx2(auVar17,_DAT_00122080);
        auVar17 = vpsubw_avx2(auVar5,auVar17);
        auVar13 = ZEXT3264(auVar17);
      } while ((int)lVar9 != 0x20000);
      auVar16 = auVar17._16_16_;
      iVar8 = vpextrw_avx(auVar17._0_16_,0);
      uVar7 = uVar7 + 1;
      data = data + 0x10000;
      auVar2 = vpalignr_avx(auVar16,auVar17._0_16_,2);
      auVar3 = vpshufb_avx(auVar16,_DAT_0011f0b0);
      auVar4 = vpshufb_avx(auVar16,auVar15);
      iVar6 = iVar6 + iVar8;
      vpextrw_avx(auVar16,7);
      auVar17 = vpmovzxwd_avx2(auVar2);
      auVar2 = vpaddd_avx(auVar3,auVar11._0_16_);
      auVar11 = ZEXT1664(auVar2);
      auVar2 = vpaddd_avx(auVar4,auVar14._0_16_);
      auVar14 = ZEXT1664(auVar2);
      auVar17 = vpaddd_avx2(auVar12._0_32_,auVar17);
      auVar12 = ZEXT3264(auVar17);
    } while (uVar7 != len >> 0x10);
    auVar13 = vpmovsxbd_avx512f(_DAT_0011f0d0);
    uVar7 = (ulong)(len & 0xffff0000);
    auVar10 = valignd_avx512f(auVar12,auVar12,0xf);
    auVar12._60_4_ = 0;
    auVar12._0_60_ = auVar10._4_60_;
    auVar11 = vpermi2d_avx512f(auVar13,auVar12 << 0x20,auVar11);
    auVar12 = vpmovsxbd_avx512f(_DAT_0011f0e0);
    auVar11 = vpermi2d_avx512f(auVar12,auVar11,auVar14);
    auVar12 = vpbroadcastd_avx512f();
    auVar14._60_4_ = auVar12._60_4_;
    auVar14._0_60_ = auVar11._0_60_;
  }
  auVar15 = vpinsrd_avx(auVar14._0_16_,iVar6,0);
  auVar11 = vinserti32x4_avx512f(auVar14,auVar15,0);
  if ((uint)uVar7 < len) {
    auVar12 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar7 = uVar7 + 1;
      auVar13 = vpbroadcastd_avx512f();
      auVar13 = vpsrlvd_avx512f(auVar13,auVar12);
      auVar13 = vpandd_avx512f(auVar13,auVar14);
      auVar11 = vpaddd_avx512f(auVar13,auVar11);
    } while (len != uVar7);
  }
  auVar11 = vmovdqu64_avx512f(auVar11);
  *(undefined1 (*) [64])flags = auVar11;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i counter = _mm256_set1_epi16(0);
    const __m256i one_mask =  _mm256_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m256i masks = _mm256_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                           1 << 11, 1 << 10, 1 << 9,  1 << 8,
                                           1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                           1 << 3,  1 << 2,  1 << 1,  1 << 0);
    uint32_t out_counters[16] = {0};
    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE(idx) counter = _mm256_add_epi16(counter, _mm256_and_si256(_mm256_cmpeq_epi16(_mm256_and_si256(_mm256_set1_epi16(_mm256_extract_epi16(_mm256_loadu_si256(data_vectors+pos), idx)), masks), masks), one_mask));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    uint32_t pos = 0;
    for (size_t i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum
        // Unroll to prevent clang (LLVM) from throwing constant integer error such as:
        // error: argument to '__builtin_ia32_vec_ext_v16hi' must be a constant integer
        out_counters[0]  += _mm256_extract_epi16(counter,  0);
        out_counters[1]  += _mm256_extract_epi16(counter,  1);
        out_counters[2]  += _mm256_extract_epi16(counter,  2);
        out_counters[3]  += _mm256_extract_epi16(counter,  3);
        out_counters[4]  += _mm256_extract_epi16(counter,  4);
        out_counters[5]  += _mm256_extract_epi16(counter,  5);
        out_counters[6]  += _mm256_extract_epi16(counter,  6);
        out_counters[7]  += _mm256_extract_epi16(counter,  7);
        out_counters[8]  += _mm256_extract_epi16(counter,  8);
        out_counters[9]  += _mm256_extract_epi16(counter,  9);
        out_counters[10] += _mm256_extract_epi16(counter, 10);
        out_counters[11] += _mm256_extract_epi16(counter, 11);
        out_counters[12] += _mm256_extract_epi16(counter, 12);
        out_counters[13] += _mm256_extract_epi16(counter, 13);
        out_counters[14] += _mm256_extract_epi16(counter, 14);
        out_counters[15] += _mm256_extract_epi16(counter, 15);

        counter = _mm256_set1_epi16(0);
    }

#undef UPDATE
#undef BLOCK

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i)
        flags[i] = out_counters[i];

    return 0;
}